

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

float VW_Predict(VW_HANDLE handle,VW_EXAMPLE e)

{
  example *in_RSI;
  example *in_RDI;
  float fVar1;
  example *ex;
  vw *pointer;
  learner<char,_char> *in_stack_000001a0;
  example *this;
  
  this = in_RSI;
  LEARNER::as_singleline<char,char>(in_stack_000001a0);
  LEARNER::learner<char,_example>::predict((learner<char,_example> *)this,in_RDI,(size_t)in_RSI);
  fVar1 = VW::get_prediction(in_RSI);
  return fVar1;
}

Assistant:

VW_DLL_MEMBER float VW_CALLING_CONV VW_Predict(VW_HANDLE handle, VW_EXAMPLE e)
{ vw * pointer = static_cast<vw*>(handle);
  example * ex = static_cast<example*>(e);
  LEARNER::as_singleline(pointer->l)->predict(*ex);
  //BUG: The below method may return garbage as it assumes a certain structure for ex->ld
  //which may not be the actual one used (e.g., for cost-sensitive multi-class learning)
  return VW::get_prediction(ex);
}